

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

xml_document * xml_open_document(FILE *source)

{
  int iVar1;
  uint8_t *buffer;
  size_t sVar2;
  xml_document *pxVar3;
  size_t __size;
  size_t length;
  
  __size = 1;
  buffer = (uint8_t *)malloc(1);
  iVar1 = feof((FILE *)source);
  length = 0;
  while (iVar1 == 0) {
    if (__size == length) {
      __size = length + 2;
      buffer = (uint8_t *)realloc(buffer,__size);
    }
    sVar2 = fread(buffer + length,1,1,(FILE *)source);
    length = length + sVar2;
    iVar1 = feof((FILE *)source);
  }
  fclose((FILE *)source);
  pxVar3 = xml_parse_document(buffer,length);
  if (pxVar3 == (xml_document *)0x0) {
    free(buffer);
  }
  return pxVar3;
}

Assistant:

struct xml_document* xml_open_document(FILE* source) {

	/* Prepare buffer
	 */
	size_t const read_chunk = 1; // TODO 4096;

	size_t document_length = 0;
	size_t buffer_size = 1;	// TODO 4069
	uint8_t* buffer = malloc(buffer_size * sizeof(uint8_t));

	/* Read hole file into buffer
	 */
	while (!feof(source)) {

		/* Reallocate buffer
		 */
		if (buffer_size - document_length < read_chunk) {
			buffer = realloc(buffer, buffer_size + 2 * read_chunk);
			buffer_size += 2 * read_chunk;
		}

		size_t read = fread(
			&buffer[document_length],
			sizeof(uint8_t), read_chunk,
			source
		);

		document_length += read;
	}
	fclose(source);

	/* Try to parse buffer
	 */
	struct xml_document* document = xml_parse_document(buffer, document_length);

	if (!document) {
		free(buffer);
		return 0;
	}
	return document;
}